

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,int index)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int local_30;
  int s;
  allocator<int> local_1e;
  undefined1 local_1d;
  int local_1c;
  Parser *pPStack_18;
  int index_local;
  Parser *this_local;
  vector<int,_std::allocator<int>_> *state;
  
  local_1d = 0;
  local_1c = index;
  pPStack_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  sVar3 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                    (&this->curr_state_vars_);
  std::allocator<int>::allocator(&local_1e);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar3,&local_1e);
  std::allocator<int>::~allocator(&local_1e);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  local_30 = (int)sVar3;
  while (iVar2 = local_1c, local_30 = local_30 + -1, -1 < local_30) {
    pvVar4 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)local_30);
    iVar1 = Variable::Size((Variable *)pvVar4);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_30);
    *pvVar5 = iVar2 % iVar1;
    pvVar4 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)local_30);
    iVar2 = Variable::Size((Variable *)pvVar4);
    local_1c = local_1c / iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(int index) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = state.size() - 1; s >= 0; s--) {
		state[s] = index % curr_state_vars_[s].Size();
		index /= curr_state_vars_[s].Size();
	}

	return state;
}